

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.c
# Opt level: O2

exr_result_t validate_part_type(exr_context_t f,exr_priv_part_t curpart)

{
  exr_attr_string_t *s;
  char *__s1;
  int iVar1;
  exr_result_t eVar2;
  _func_exr_result_t_exr_const_context_t_exr_result_t_char_ptr_varargs *UNRECOVERED_JUMPTABLE;
  char *pcVar3;
  
  if (curpart->type != (exr_attribute_t *)0x0) {
    if (f->is_singlepart_tiled == '\0') {
      if (3 < (ulong)curpart->storage_mode) goto LAB_0012b784;
      pcVar3 = &DAT_001b4118 + *(int *)(&DAT_001b4118 + (ulong)curpart->storage_mode * 4);
    }
    else {
      if ((f->is_multipart != '\0') || (1 < f->num_parts)) {
        UNRECOVERED_JUMPTABLE = f->print_error;
        pcVar3 = "Multipart files cannot have the tiled bit set";
        goto LAB_0012b798;
      }
      pcVar3 = "tiledimage";
      if ((curpart->storage_mode != EXR_STORAGE_TILED) &&
         (curpart->storage_mode = EXR_STORAGE_TILED, f->strict_header != '\0')) {
        UNRECOVERED_JUMPTABLE = f->print_error;
        pcVar3 = 
        "attribute \'type\': Single part tiled flag set but not marked as tiled storage type";
        goto LAB_0012b798;
      }
    }
    s = (curpart->type->field_6).string;
    __s1 = s->str;
    iVar1 = strcmp(__s1,pcVar3);
    if (iVar1 != 0) {
      if (f->mode == '\x01') {
        return 0xe;
      }
      if (f->strict_header != '\0') {
        eVar2 = (*f->print_error)(f,0xe,
                                  "attribute \'type\': Type should be \'%s\' but set to \'%s\', believing file flags"
                                  ,pcVar3,__s1,f->print_error);
        return eVar2;
      }
      eVar2 = exr_attr_string_set(f,s,pcVar3);
      if (eVar2 != 0) {
        UNRECOVERED_JUMPTABLE = f->print_error;
        pcVar3 = "attribute \'type\': Mismatch between file flags and type attribute, unable to fix"
        ;
        goto LAB_0012b798;
      }
    }
  }
LAB_0012b784:
  if (curpart->storage_mode != EXR_STORAGE_LAST_TYPE) {
    return 0;
  }
  UNRECOVERED_JUMPTABLE = f->print_error;
  pcVar3 = "Unable to determine data storage type for part";
LAB_0012b798:
  eVar2 = (*UNRECOVERED_JUMPTABLE)(f,0xe,pcVar3,UNRECOVERED_JUMPTABLE);
  return eVar2;
}

Assistant:

static exr_result_t
validate_part_type (exr_context_t f, exr_priv_part_t curpart)
{
    // TODO: there are probably more tests to add here...
    if (curpart->type)
    {
        const char *expectedtype = NULL;
        exr_result_t rv;

        // see if the type overwrote the storage mode
        if (f->is_singlepart_tiled)
        {
            if (f->is_multipart || f->num_parts > 1)
                return f->print_error (
                    f,
                    EXR_ERR_INVALID_ATTR,
                    "Multipart files cannot have the tiled bit set");

            if (curpart->storage_mode != EXR_STORAGE_TILED)
            {
                curpart->storage_mode = EXR_STORAGE_TILED;

                if (f->strict_header)
                {
                    return f->print_error (
                        f,
                        EXR_ERR_INVALID_ATTR,
                        "attribute 'type': Single part tiled flag set but not marked as tiled storage type");
                }
            }
        }

        if (curpart->storage_mode == EXR_STORAGE_SCANLINE)
            expectedtype = "scanlineimage";
        else if (curpart->storage_mode == EXR_STORAGE_TILED)
            expectedtype = "tiledimage";
        else if (curpart->storage_mode == EXR_STORAGE_DEEP_SCANLINE)
            expectedtype = "deepscanline";
        else if (curpart->storage_mode == EXR_STORAGE_DEEP_TILED)
            expectedtype = "deeptile";

        if (expectedtype && 0 != strcmp (curpart->type->string->str, expectedtype))
        {
            if (f->mode == EXR_CONTEXT_WRITE) return EXR_ERR_INVALID_ATTR;

            if (f->strict_header)
            {
                return f->print_error (
                    f,
                    EXR_ERR_INVALID_ATTR,
                    "attribute 'type': Type should be '%s' but set to '%s', believing file flags",
                    expectedtype,
                    curpart->type->string->str);
            }
            else
            {
                /* C++ silently changed this */
                rv = exr_attr_string_set (
                    f, curpart->type->string, expectedtype);

                if (rv != EXR_ERR_SUCCESS)
                    return f->print_error (
                        f,
                        EXR_ERR_INVALID_ATTR,
                        "attribute 'type': Mismatch between file flags and type attribute, unable to fix");
            }
        }
    }

    /* NB: we allow an 'unknown' storage type of EXR_STORAGE_UNKNOWN
     * for future proofing */
    if (curpart->storage_mode == EXR_STORAGE_LAST_TYPE)
    {
        return f->print_error (
            f,
            EXR_ERR_INVALID_ATTR,
            "Unable to determine data storage type for part");
    }

    return EXR_ERR_SUCCESS;
}